

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O1

int fits_parser_workfn(long totalrows,long offset,long firstrow,long nrows,int nCols,
                      iteratorCol *colData,void *userPtr)

{
  byte *pbVar1;
  double dVar2;
  char cVar3;
  int iVar4;
  int *piVar5;
  DataInfo *pDVar6;
  Node *pNVar7;
  undefined8 *__dest;
  size_t sVar8;
  byte bVar9;
  uint uVar10;
  int iVar11;
  lval *plVar12;
  long lVar13;
  char *pcVar14;
  char *pcVar15;
  long *plVar16;
  void *pvVar17;
  long lVar18;
  undefined8 *puVar19;
  undefined4 uVar20;
  long lVar21;
  long lVar22;
  undefined8 uVar23;
  size_t sVar24;
  iteratorCol *piVar25;
  iteratorCol *piVar26;
  size_t sVar27;
  ParseData *lParse;
  byte bVar28;
  long lVar29;
  Node *pNVar30;
  int iVar31;
  double *pdVar32;
  long lVar33;
  bool bVar34;
  ulong local_120;
  size_t local_118;
  Node *local_110;
  int local_104;
  size_t local_100;
  iteratorCol *local_f8;
  size_t local_f0;
  iteratorCol *local_e8;
  long local_e0;
  int status;
  long local_d0;
  ParseData *local_c8;
  long local_c0;
  size_t local_b8;
  long local_b0;
  long zeros [4];
  char msg [80];
  
  local_104 = 0;
  lParse = *(ParseData **)((long)userPtr + 0x28);
  zeros[2] = 0;
  zeros[3] = 0;
  zeros[0] = 0;
  zeros[1] = 0;
  local_f8 = colData;
  local_d0 = totalrows;
  if (DEBUG_PIXFILTER != 0) {
    printf("fits_parser_workfn(total=%ld, offset=%ld, first=%ld, rows=%ld, cols=%d)\n",totalrows,
           offset,firstrow,nrows,(ulong)(uint)nCols);
  }
  piVar26 = local_f8;
  local_e8 = local_f8 + nCols;
  local_118 = CONCAT44(local_118._4_4_,nCols);
  if (offset + 1 == firstrow) {
    *(void **)((long)userPtr + 0x68) = userPtr;
    *(undefined4 *)((long)userPtr + 0x20) = 0;
    local_120 = 0;
    if (0 < nCols) {
      piVar25 = lParse->colData;
      do {
        piVar25[local_120].repeat = local_f8[local_120].repeat;
        local_120 = local_120 + 1;
      } while ((long)local_120 < (long)nCols);
    }
    lVar13 = *(long *)((long)userPtr + 0x18);
    if (lVar13 < 1) {
      lVar33 = local_d0;
      if (lVar13 == 0) {
        lVar33 = nrows;
      }
    }
    else {
      lVar33 = lVar13;
      if (local_d0 <= lVar13) {
        lVar33 = local_d0;
      }
    }
    *(long *)((long)userPtr + 0x18) = lVar33;
    *(long *)((long)userPtr + 0x48) = lVar33 + firstrow + -1;
    if (*(long *)((long)userPtr + 8) == 0) {
      iVar31 = local_e8[-1].iotype;
      if (iVar31 == 0) {
        ffpmsg("Output column for parser results not found!");
        return 0x1b2;
      }
      *(void **)((long)userPtr + 0x38) = local_e8[-1].array;
      *(int *)userPtr = local_e8[-1].datatype;
      status = 0;
      *(undefined8 *)((long)userPtr + 0x60) = 0;
      if (lParse->hdutype == 0) {
        lVar13 = lParse->pixFilter->blank;
        if (lVar13 != 0) goto LAB_0012eb27;
      }
      else {
        if (iVar31 != 3) {
          ffgknjj(local_e8[-1].fptr,"TNULL",local_e8[-1].colnum,1,(LONGLONG *)((long)userPtr + 0x60)
                  ,(int *)&local_120,&status);
        }
        if ((status == 0x193) || (local_e8[-1].iotype == 3)) {
          iVar31 = **(int **)((long)userPtr + 0x68);
          if (iVar31 == 0x15) {
            lVar13 = -0x8000;
          }
          else if (iVar31 == 0x29) {
            lVar13 = -0x8000000000000000;
          }
          else {
            if (iVar31 != 0x1f) goto LAB_0012eb2b;
            lVar13 = -0x80000000;
          }
LAB_0012eb27:
          *(LONGLONG *)((long)userPtr + 0x60) = lVar13;
        }
      }
LAB_0012eb2b:
      plVar12 = (lval *)&local_e8[-1].repeat;
      nCols = (int)local_118;
    }
    else {
      *(long *)((long)userPtr + 0x30) = *(long *)((long)userPtr + 8);
      plVar16 = zeros;
      if (*(long **)((long)userPtr + 0x10) != (long *)0x0) {
        plVar16 = *(long **)((long)userPtr + 0x10);
      }
      *(long **)((long)userPtr + 0x38) = plVar16;
      plVar12 = &lParse->Nodes[lParse->resultNode].value;
    }
    *(long *)((long)userPtr + 0x50) = plVar12->nelem;
    iVar31 = **(int **)((long)userPtr + 0x68);
    if (iVar31 < 0x1f) {
      uVar20 = 1;
      if (iVar31 < 0xe) {
        if ((iVar31 != 1) && (iVar31 != 0xb)) goto LAB_0012eba9;
      }
      else if (iVar31 != 0xe) {
        if (iVar31 == 0x10) goto LAB_0012eb99;
        if (iVar31 != 0x15) goto LAB_0012eba9;
        uVar20 = 2;
      }
LAB_0012eba5:
      *(undefined4 *)((long)userPtr + 0x40) = uVar20;
    }
    else if (iVar31 < 0x2a) {
      if (iVar31 == 0x1f) goto LAB_0012eba0;
      if (iVar31 == 0x29) goto LAB_0012eb99;
    }
    else {
      if (iVar31 == 0x2a) {
LAB_0012eba0:
        uVar20 = 4;
        goto LAB_0012eba5;
      }
      if ((iVar31 == 0x51) || (iVar31 == 0x52)) {
LAB_0012eb99:
        uVar20 = 8;
        goto LAB_0012eba5;
      }
    }
LAB_0012eba9:
    uVar10 = lParse->Nodes[lParse->resultNode].type - 0x102;
    if (uVar10 < 3) {
      *(undefined8 *)((long)userPtr + 0x58) = *(undefined8 *)(&DAT_0021ff68 + (ulong)uVar10 * 8);
    }
  }
  piVar5 = *(int **)((long)userPtr + 0x68);
  if (*(long *)(piVar5 + 2) != 0) goto LAB_0012ebe7;
  *(long *)((long)userPtr + 0x30) = (long)*(int *)((long)userPtr + 0x40) + (long)local_e8[-1].array;
  if ((local_e8[-1].iotype == 3) && (*(long *)(piVar5 + 4) != 0)) {
    *(long *)((long)userPtr + 0x38) = *(long *)(piVar5 + 4);
    goto LAB_0012ebe7;
  }
  iVar31 = *piVar5;
  if (iVar31 < 0x1f) {
    if (iVar31 < 0x10) {
      if (iVar31 == 0xb) {
        **(undefined1 **)((long)userPtr + 0x38) = *(undefined1 *)((long)userPtr + 0x60);
      }
      else if (iVar31 == 0xe) {
        **(undefined1 **)((long)userPtr + 0x38) = 0x55;
      }
    }
    else if (iVar31 == 0x10) {
      *(undefined1 *)**(undefined8 **)((long)userPtr + 0x38) = 1;
      *(undefined1 *)(**(long **)((long)userPtr + 0x38) + 1) = 0;
    }
    else if (iVar31 == 0x15) {
      **(undefined2 **)((long)userPtr + 0x38) = *(undefined2 *)((long)userPtr + 0x60);
    }
    goto LAB_0012ebe7;
  }
  if (iVar31 < 0x2a) {
    if (iVar31 == 0x1f) {
      **(undefined4 **)((long)userPtr + 0x38) = *(undefined4 *)((long)userPtr + 0x60);
      goto LAB_0012ebe7;
    }
    if (iVar31 != 0x29) goto LAB_0012ebe7;
LAB_0012fbba:
    puVar19 = *(undefined8 **)((long)userPtr + 0x38);
    uVar23 = *(undefined8 *)((long)userPtr + 0x60);
  }
  else {
    if (iVar31 == 0x2a) {
      **(undefined4 **)((long)userPtr + 0x38) = 0x8541f136;
      goto LAB_0012ebe7;
    }
    if (iVar31 == 0x51) goto LAB_0012fbba;
    if (iVar31 != 0x52) goto LAB_0012ebe7;
    puVar19 = *(undefined8 **)((long)userPtr + 0x38);
    uVar23 = 0xb8a83e285ebab4b7;
  }
  *puVar19 = uVar23;
LAB_0012ebe7:
  lVar13 = *(long *)((long)userPtr + 0x48) - firstrow;
  sVar27 = lVar13 + 1;
  if (nrows <= lVar13) {
    sVar27 = nrows;
  }
  local_b0 = *(long *)((long)userPtr + 0x30);
  lParse->firstDataRow = firstrow;
  lParse->nDataRows = sVar27;
  if (0 < nCols) {
    local_f0 = lParse->nPrevDataRows;
    local_b8 = sVar27 * 8;
    iVar31 = 0;
    local_100 = sVar27;
    local_e0 = firstrow;
    do {
      piVar25 = local_f8;
      bVar34 = false;
      if ((piVar26[iVar31].iotype & 0xfffffffeU) == 2) goto LAB_0012f139;
      pDVar6 = lParse->varData;
      local_110 = (Node *)CONCAT44(local_110._4_4_,iVar31);
      if (4 < pDVar6[iVar31].type - 0x102U) {
        snprintf(msg,0x50,"SetupDataArrays, unhandled type %d\n");
        ffpmsg(msg);
        sVar27 = local_100;
        iVar31 = (int)local_110;
        goto LAB_0012f05f;
      }
      lVar13 = pDVar6[iVar31].nelem;
      sVar24 = lVar13 * sVar27;
      nCols = (int)local_118;
      iVar11 = iVar31;
      switch(pDVar6[iVar31].type) {
      case 0x102:
        pcVar15 = (char *)piVar26[iVar31].array;
        if (local_f0 != sVar27) {
          if (pDVar6[iVar31].undef != (char *)0x0) {
            free(pDVar6[iVar31].undef);
          }
          pcVar14 = (char *)malloc(sVar24);
          pDVar6[iVar31].undef = pcVar14;
          iVar11 = (int)local_110;
          sVar27 = local_100;
          if (pcVar14 == (char *)0x0) {
LAB_0012ef22:
            iVar31 = (int)local_110;
            lParse->status = 0x71;
            piVar26 = local_f8;
            sVar27 = local_100;
            goto LAB_0012f05f;
          }
        }
        for (; sVar24 != 0; sVar24 = sVar24 - 1) {
          if (*pcVar15 == '\0') {
            bVar34 = false;
          }
          else {
            bVar34 = *pcVar15 == pcVar15[sVar24];
          }
          pDVar6[iVar31].undef[sVar24 - 1] = bVar34;
        }
        pdVar32 = (double *)(pcVar15 + 1);
        goto LAB_0012eedc;
      case 0x103:
        pdVar32 = (double *)piVar26[iVar31].array;
        if (local_f0 != sVar27) {
          if (pDVar6[iVar31].undef != (char *)0x0) {
            free(pDVar6[iVar31].undef);
          }
          pcVar15 = (char *)malloc(sVar24);
          pDVar6[iVar31].undef = pcVar15;
          iVar11 = (int)local_110;
          sVar27 = local_100;
          if (pcVar15 == (char *)0x0) goto LAB_0012ef22;
        }
        for (; sVar24 != 0; sVar24 = sVar24 - 1) {
          if (*pdVar32 == 0.0) {
            bVar34 = false;
          }
          else {
            bVar34 = *pdVar32 == pdVar32[sVar24];
          }
          pDVar6[iVar31].undef[sVar24 - 1] = bVar34;
        }
        break;
      case 0x104:
        pdVar32 = (double *)piVar26[iVar31].array;
        if (local_f0 != sVar27) {
          if (pDVar6[iVar31].undef != (char *)0x0) {
            free(pDVar6[iVar31].undef);
          }
          pcVar15 = (char *)malloc(sVar24);
          pDVar6[iVar31].undef = pcVar15;
          iVar11 = (int)local_110;
          sVar27 = local_100;
          if (pcVar15 == (char *)0x0) goto LAB_0012ef22;
        }
        for (; sVar24 != 0; sVar24 = sVar24 - 1) {
          dVar2 = *pdVar32;
          if ((dVar2 != 0.0) || (NAN(dVar2))) {
            bVar9 = -(dVar2 == pdVar32[sVar24]) & 1;
          }
          else {
            bVar9 = 0;
          }
          pDVar6[iVar31].undef[sVar24 - 1] = bVar9;
        }
        break;
      case 0x105:
        puVar19 = (undefined8 *)piVar26[iVar31].array;
        sVar24 = local_100;
        sVar8 = sVar27;
        if (local_f0 != sVar27) {
          if (pDVar6[iVar31].undef != (char *)0x0) {
            free(pDVar6[iVar31].undef);
          }
          sVar27 = local_100;
          pcVar15 = (char *)malloc(local_100);
          pDVar6[iVar31].undef = pcVar15;
          iVar11 = (int)local_110;
          sVar24 = local_100;
          sVar8 = sVar27;
          if (pcVar15 == (char *)0x0) {
            lParse->status = 0x71;
            goto LAB_0012f05a;
          }
        }
        while (sVar27 = local_100, local_100 = sVar27, sVar8 != 0) {
          cVar3 = *(char *)*puVar19;
          if ((cVar3 == '\0') || (cVar3 != *(char *)puVar19[sVar24])) {
            bVar34 = false;
          }
          else {
            iVar11 = strcmp((char *)*puVar19,(char *)puVar19[sVar24]);
            bVar34 = iVar11 == 0;
            iVar11 = (int)local_110;
          }
          pDVar6[iVar31].undef[sVar24 - 1] = bVar34;
          sVar24 = sVar24 - 1;
          sVar8 = sVar24;
        }
        pDVar6[iVar31].data = puVar19 + 1;
        goto LAB_0012f05a;
      case 0x106:
        lVar33 = lVar13 + 1;
        plVar16 = (long *)pDVar6[iVar31].data;
        if (local_f0 != sVar27) {
          local_c0 = lVar33;
          if (plVar16 != (long *)0x0) {
            if ((void *)*plVar16 == (void *)0x0) {
              printf("invalid free(bitStrs[0]) at %s:%d\n",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                     ,0x599);
            }
            else {
              free((void *)*plVar16);
            }
          }
          free(plVar16);
          plVar16 = (long *)malloc(local_b8);
          if (plVar16 != (long *)0x0) {
            pvVar17 = malloc(local_c0 * local_100);
            *plVar16 = (long)pvVar17;
            if (pvVar17 != (void *)0x0) {
              sVar27 = local_100;
              lVar33 = local_c0;
              iVar11 = (int)local_110;
              goto LAB_0012efa1;
            }
            free(plVar16);
          }
          pDVar6[iVar31].undef = (char *)0x0;
          pDVar6[iVar31].data = (void *)0x0;
          lParse->status = 0x71;
          piVar26 = local_f8;
          sVar27 = local_100;
          nCols = (int)local_118;
          iVar31 = (int)local_110;
          goto LAB_0012f05f;
        }
LAB_0012efa1:
        if (0 < (long)sVar27) {
          lVar18 = lVar13 + 0xe;
          if (-1 < lVar13 + 7) {
            lVar18 = lVar13 + 7;
          }
          sVar24 = 0;
          do {
            plVar16[sVar24] = sVar24 * lVar33 + *plVar16;
            if (lVar13 < 1) {
              lVar22 = 0;
            }
            else {
              lVar21 = sVar24 * (lVar18 >> 3) + 1;
              lVar29 = 0;
              do {
                uVar10 = (uint)lVar29 & 7;
                *(byte *)(plVar16[sVar24] + lVar29) =
                     (*(byte *)((long)piVar26[iVar31].array + lVar21) >> ((byte)uVar10 ^ 7) & 1) ==
                     0 ^ 0x31;
                lVar21 = lVar21 + (ulong)(uVar10 == 7);
                lVar29 = lVar29 + 1;
                lVar22 = lVar13;
                sVar27 = local_100;
              } while (lVar13 != lVar29);
            }
            *(undefined1 *)(plVar16[sVar24] + lVar22) = 0;
            sVar24 = sVar24 + 1;
          } while (sVar24 != sVar27);
        }
        pDVar6[iVar31].undef = (char *)plVar16;
        pDVar6[iVar31].data = plVar16;
        piVar25 = local_f8;
LAB_0012f05a:
        piVar26 = piVar25;
        nCols = (int)local_118;
        iVar31 = iVar11;
        goto LAB_0012f05f;
      }
      pdVar32 = pdVar32 + 1;
LAB_0012eedc:
      pDVar6[iVar31].data = pdVar32;
      piVar26 = local_f8;
      iVar31 = iVar11;
LAB_0012f05f:
      if (lParse->status == 0) {
        bVar34 = false;
        firstrow = local_e0;
      }
      else {
        bVar34 = iVar31 != 0;
        iVar31 = iVar31 + -1;
        if (bVar34) {
          lVar33 = (long)iVar31 + 1;
          lVar13 = (long)iVar31 * 0xa0 + 0x98;
          do {
            pDVar6 = lParse->varData;
            if (*(int *)(pDVar6->name + lVar13 + -0x44) == 0x106) {
              if ((void *)**(undefined8 **)(pDVar6->name + lVar13) == (void *)0x0) {
                printf("invalid free(((char**)varData->data)[0]) at %s:%d\n",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                       ,0x60c);
              }
              else {
                free((void *)**(undefined8 **)(pDVar6->name + lVar13));
              }
            }
            if (*(void **)(pDVar6->name + lVar13 + -8) == (void *)0x0) {
              printf("invalid free(varData->undef) at %s:%d\n",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                     ,0x60d);
            }
            else {
              free(*(void **)(pDVar6->name + lVar13 + -8));
            }
            pcVar15 = pDVar6->name + lVar13 + -8;
            pcVar15[0] = '\0';
            pcVar15[1] = '\0';
            pcVar15[2] = '\0';
            pcVar15[3] = '\0';
            pcVar15[4] = '\0';
            pcVar15[5] = '\0';
            pcVar15[6] = '\0';
            pcVar15[7] = '\0';
            lVar13 = lVar13 + -0xa0;
            lVar33 = lVar33 + -1;
          } while (lVar33 != 0);
          iVar31 = -1;
          sVar27 = local_100;
          nCols = (int)local_118;
        }
        lParse->nPrevDataRows = 0;
        bVar34 = true;
        firstrow = local_e0;
      }
LAB_0012f139:
      if (bVar34) goto LAB_0012f18a;
      iVar31 = iVar31 + 1;
    } while (iVar31 < nCols);
  }
  lParse->nPrevDataRows = sVar27;
LAB_0012f18a:
  if (sVar27 != 0) {
    piVar26 = (iteratorCol *)&lParse->status;
    iVar31 = 0;
    local_f8 = piVar26;
    local_c8 = lParse;
    do {
      local_118 = 10000;
      if ((long)sVar27 < 10000) {
        local_118 = sVar27;
      }
      local_100 = sVar27;
      Evaluate_Parser(lParse,firstrow,local_118);
      if (lParse->status != 0) break;
      pNVar7 = lParse->Nodes;
      iVar11 = lParse->resultNode;
      pNVar30 = pNVar7 + iVar11;
      iVar4 = pNVar7[iVar11].type;
      if (pNVar7[iVar11].operation == -1000) {
        iVar31 = 1;
      }
      local_110 = pNVar30;
      if (iVar4 - 0x102U < 3) {
        local_f0 = CONCAT44(local_f0._4_4_,iVar31);
        if (iVar31 == 0) {
          lVar13 = *(long *)((long)userPtr + 0x50);
          lVar33 = (pNVar30->value).nelem;
          if (lVar13 == lVar33) {
            ffcvtn(lParse->datatype,(pNVar30->value).data.ptr,(pNVar30->value).undef,
                   lVar33 * local_118,**(int **)((long)userPtr + 0x68),
                   *(void **)((long)userPtr + 0x38),*(void **)((long)userPtr + 0x30),&local_104,
                   (int *)piVar26);
            pNVar30 = local_110;
          }
          else if (lVar33 == 1) {
            if (0 < (long)local_100) {
              sVar27 = 0;
              do {
                local_120 = 0;
                lVar13 = *(long *)((long)userPtr + 0x50);
                if (0 < lVar13) {
                  do {
                    ffcvtn(lParse->datatype,
                           (double *)
                           (*(long *)((long)userPtr + 0x58) * sVar27 +
                           (long)(pNVar30->value).data.dblptr),(pNVar30->value).undef + sVar27,1,
                           **(int **)((long)userPtr + 0x68),*(void **)((long)userPtr + 0x38),
                           (void *)((long)*(int *)((long)userPtr + 0x40) *
                                    (lVar13 * sVar27 + local_120) + *(long *)((long)userPtr + 0x30))
                           ,&local_104,(int *)piVar26);
                    local_120 = local_120 + 1;
                    lVar13 = *(long *)((long)userPtr + 0x50);
                    pNVar30 = local_110;
                  } while ((long)local_120 < lVar13);
                }
                sVar27 = sVar27 + 1;
                iVar31 = (int)local_f0;
              } while (sVar27 != local_118);
            }
          }
          else if (0 < (long)local_100) {
            if (lVar13 < lVar33) {
              lVar33 = lVar13;
            }
            local_f0 = (size_t)(int)lVar33;
            sVar27 = 0;
            local_e0 = firstrow;
            do {
              sVar24 = local_f0;
              lVar13 = (local_110->value).nelem * sVar27;
              ffcvtn(lParse->datatype,
                     (double *)
                     (*(long *)((long)userPtr + 0x58) * lVar13 +
                     (long)(local_110->value).data.dblptr),(local_110->value).undef + lVar13,
                     local_f0,**(int **)((long)userPtr + 0x68),*(void **)((long)userPtr + 0x38),
                     (void *)((long)*(int *)((long)userPtr + 0x40) *
                              *(long *)((long)userPtr + 0x50) * sVar27 +
                             *(long *)((long)userPtr + 0x30)),&local_104,(int *)piVar26);
              lVar13 = *(long *)((long)userPtr + 0x50);
              lVar33 = lVar13 - sVar24;
              if (lVar33 != 0 && (long)sVar24 <= lVar13) {
                memset((void *)((lVar13 * sVar27 + local_f0) * (long)*(int *)((long)userPtr + 0x40)
                               + *(long *)((long)userPtr + 0x30)),0,
                       lVar33 * *(int *)((long)userPtr + 0x40));
              }
              sVar27 = sVar27 + 1;
              pNVar30 = local_110;
              firstrow = local_e0;
            } while (local_118 != sVar27);
          }
          if (0 < pNVar30->operation) {
            pvVar17 = (pNVar30->value).data.ptr;
            if (pvVar17 == (void *)0x0) {
              printf("invalid free(result->value.data.ptr) at %s:%d\n",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                     ,0x4df);
              pNVar30 = local_110;
            }
            else {
              free(pvVar17);
              pNVar30 = local_110;
            }
          }
        }
        else {
          msg[0] = '\0';
          local_e0 = firstrow;
          if (0 < (long)local_100) {
            plVar12 = &pNVar30->value;
            sVar27 = 0;
            do {
              piVar26 = local_f8;
              local_120 = 0;
              lVar13 = *(long *)((long)userPtr + 0x50);
              if (0 < lVar13) {
                do {
                  ffcvtn(local_c8->datatype,&plVar12->data,msg,(pNVar30->value).nelem,
                         **(int **)((long)userPtr + 0x68),*(void **)((long)userPtr + 0x38),
                         (void *)((long)*(int *)((long)userPtr + 0x40) *
                                  (lVar13 * sVar27 + local_120) + *(long *)((long)userPtr + 0x30)),
                         &local_104,(int *)piVar26);
                  local_120 = local_120 + 1;
                  lVar13 = *(long *)((long)userPtr + 0x50);
                  pNVar30 = local_110;
                } while ((long)local_120 < lVar13);
              }
              sVar27 = sVar27 + 1;
            } while (sVar27 != local_118);
          }
          lParse = local_c8;
          piVar26 = local_f8;
          firstrow = local_e0;
          iVar31 = (int)local_f0;
        }
        if (*(int *)&piVar26->fptr == -0xb) {
          *(int *)&piVar26->fptr = 0x19c;
          ffpmsg("Numerical overflow while converting expression to necessary datatype");
          pNVar30 = local_110;
        }
      }
      else if (iVar4 == 0x105) {
        if (**(int **)((long)userPtr + 0x68) == 0x10) {
          iVar11 = local_104;
          if (iVar31 == 0) {
            local_120 = 0;
            if (0 < (long)local_100) {
              do {
                if ((local_110->value).undef[local_120] == '\0') {
                  pdVar32 = (local_110->value).data.dblptr + local_120;
                }
                else {
                  pdVar32 = *(double **)((long)userPtr + 0x38);
                  iVar11 = 1;
                }
                strcpy(*(char **)(*(long *)((long)userPtr + 0x30) + local_120 * 8),(char *)*pdVar32)
                ;
                local_120 = local_120 + 1;
              } while ((long)local_120 < (long)local_118);
            }
          }
          else {
            local_120 = 0;
            if (0 < (long)local_100) {
              do {
                strcpy(*(char **)(*(long *)((long)userPtr + 0x30) + local_120 * 8),
                       &(pNVar30->value).data.log);
                local_120 = local_120 + 1;
                iVar11 = local_104;
              } while ((long)local_120 < (long)local_118);
            }
          }
        }
        else {
          ffpmsg("Cannot convert string expression to desired type.");
          *(int *)&piVar26->fptr = 0x1b0;
          iVar11 = local_104;
        }
        local_104 = iVar11;
        pNVar30 = local_110;
        if (0 < local_110->operation) {
          pcVar15 = *(local_110->value).data.strptr;
          if (pcVar15 == (char *)0x0) {
            printf("invalid free(result->value.data.strptr[0]) at %s:%d\n",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                   ,0x535);
          }
          else {
            free(pcVar15);
          }
          pvVar17 = (local_110->value).data.ptr;
          if (pvVar17 != (void *)0x0) goto LAB_0012f972;
          uVar23 = 0x536;
LAB_0012f98c:
          printf("invalid free(result->value.data.strptr) at %s:%d\n",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                 ,uVar23);
          pNVar30 = local_110;
        }
      }
      else if (iVar4 == 0x106) {
        iVar11 = **(int **)((long)userPtr + 0x68);
        if (iVar11 < 0xe) {
          if (iVar11 == 1) {
LAB_0012f5f7:
            if (iVar31 == 0) {
              if (0 < (long)local_100) {
                sVar27 = 0;
                do {
                  local_120 = 0;
                  lVar13 = (pNVar30->value).nelem;
                  if (0 < lVar13) {
                    do {
                      *(bool *)(lVar13 * sVar27 + *(long *)((long)userPtr + 0x30) + local_120) =
                           *(char *)((long)(pNVar30->value).data.dblptr[sVar27] + local_120) == '1';
                      local_120 = local_120 + 1;
                      lVar13 = (pNVar30->value).nelem;
                    } while ((long)local_120 < lVar13);
                  }
                  sVar27 = sVar27 + 1;
                } while (sVar27 != local_118);
              }
            }
            else if (0 < (long)local_100) {
              sVar27 = 0;
              do {
                local_120 = 0;
                lVar13 = (pNVar30->value).nelem;
                if (0 < lVar13) {
                  do {
                    *(bool *)(lVar13 * sVar27 + *(long *)((long)userPtr + 0x30) + local_120) =
                         *(char *)((long)(pNVar30->value).naxes + local_120 + 0x30) == '1';
                    local_120 = local_120 + 1;
                    lVar13 = (pNVar30->value).nelem;
                  } while ((long)local_120 < lVar13);
                }
                sVar27 = sVar27 + 1;
              } while (sVar27 != local_118);
            }
          }
          else if (iVar11 == 0xb) {
            if (0 < (long)local_100) {
              lVar13 = -1;
              sVar27 = 0;
              do {
                local_120 = 0;
                if (0 < (pNVar30->value).nelem) {
                  do {
                    if ((local_120 & 7) == 0) {
                      *(undefined1 *)(*(long *)((long)userPtr + 0x30) + 1 + lVar13) = 0;
                      lVar13 = lVar13 + 1;
                    }
                    if (iVar31 == 0) {
                      cVar3 = *(char *)((long)(pNVar30->value).data.dblptr[sVar27] + local_120);
                    }
                    else {
                      cVar3 = *(char *)((long)(pNVar30->value).naxes + local_120 + 0x30);
                    }
                    if (cVar3 == '1') {
                      bVar9 = (byte)local_120;
                      bVar28 = bVar9 + 7;
                      if (-1 < (long)local_120) {
                        bVar28 = bVar9;
                      }
                      pbVar1 = (byte *)(*(long *)((long)userPtr + 0x30) + lVar13);
                      *pbVar1 = *pbVar1 | (byte)(0x80 >> (bVar9 - (bVar28 & 0xf8) & 0x1f));
                    }
                    local_120 = local_120 + 1;
                  } while ((long)local_120 < (pNVar30->value).nelem);
                }
                sVar27 = sVar27 + 1;
              } while (sVar27 != local_118);
            }
          }
          else {
LAB_0012f78f:
            ffpmsg("Cannot convert bit expression to desired type.");
            *(int *)&piVar26->fptr = 0x1b0;
          }
        }
        else {
          if (iVar11 == 0xe) goto LAB_0012f5f7;
          if (iVar11 != 0x10) goto LAB_0012f78f;
          local_120 = 0;
          if (iVar31 == 0) {
            if (0 < (long)local_100) {
              do {
                strcpy(*(char **)(*(long *)((long)userPtr + 0x30) + local_120 * 8),
                       (char *)(local_110->value).data.dblptr[local_120]);
                local_120 = local_120 + 1;
              } while ((long)local_120 < (long)local_118);
            }
          }
          else if (0 < (long)local_100) {
            do {
              strcpy(*(char **)(*(long *)((long)userPtr + 0x30) + local_120 * 8),
                     &(pNVar30->value).data.log);
              local_120 = local_120 + 1;
            } while ((long)local_120 < (long)local_118);
          }
        }
        pNVar30 = local_110;
        if (0 < local_110->operation) {
          pcVar15 = *(local_110->value).data.strptr;
          if (pcVar15 == (char *)0x0) {
            printf("invalid free(result->value.data.strptr[0]) at %s:%d\n",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                   ,0x51b);
          }
          else {
            free(pcVar15);
          }
          pvVar17 = (local_110->value).data.ptr;
          if (pvVar17 == (void *)0x0) {
            uVar23 = 0x51c;
            goto LAB_0012f98c;
          }
LAB_0012f972:
          free(pvVar17);
          pNVar30 = local_110;
        }
      }
      firstrow = firstrow + local_118;
      if (*(int *)&piVar26->fptr != 0) break;
      if (pNVar30->type == 0x105) {
        lVar13 = (long)*(int *)((long)userPtr + 0x40) * local_118;
      }
      else if ((pNVar30->type == 0x106) && (**(int **)((long)userPtr + 0x68) == 0xb)) {
        lVar33 = (pNVar30->value).nelem;
        lVar13 = lVar33 + 7;
        lVar33 = lVar33 + 0xe;
        if (-1 < lVar13) {
          lVar33 = lVar13;
        }
        lVar13 = (long)*(int *)((long)userPtr + 0x40) * local_118 * (lVar33 >> 3);
      }
      else {
        lVar13 = (long)*(int *)((long)userPtr + 0x40) * local_118 * *(long *)((long)userPtr + 0x50);
      }
      *(long *)((long)userPtr + 0x30) = lVar13 + *(long *)((long)userPtr + 0x30);
      sVar27 = local_100 - local_118;
    } while (sVar27 != 0);
  }
  puVar19 = *(undefined8 **)((long)userPtr + 0x38);
  __dest = (undefined8 *)local_e8[-1].array;
  if ((puVar19 != __dest) && (local_b0 == (long)__dest + (long)*(int *)((long)userPtr + 0x40))) {
    if (**(int **)((long)userPtr + 0x68) == 0x10) {
      *(undefined2 *)__dest = *(undefined2 *)*puVar19;
    }
    else {
      memcpy(__dest,puVar19,(long)*(int *)((long)userPtr + 0x40));
    }
  }
  if (local_104 == 0) {
    puVar19 = *(undefined8 **)((long)userPtr + 0x38);
    if (puVar19 == (undefined8 *)local_e8[-1].array) {
      if (**(int **)((long)userPtr + 0x68) == 0x10) {
        *(undefined2 *)*puVar19 = (undefined2)zeros[0];
      }
      else {
        memcpy(puVar19,zeros,(long)*(int *)((long)userPtr + 0x40));
      }
    }
  }
  else {
    *(undefined4 *)(*(long *)((long)userPtr + 0x68) + 0x20) = 1;
  }
  if ((((lParse->hdutype == 0) || (firstrow + -1 != *(long *)((long)userPtr + 0x48))) ||
      (lParse->status != 0)) ||
     (iVar31 = -1, local_d0 <= *(long *)(*(long *)((long)userPtr + 0x68) + 0x18))) {
    iVar31 = lParse->status;
  }
  return iVar31;
}

Assistant:

int fits_parser_workfn( long    totalrows,     /* I - Total rows to be processed     */
                long    offset,        /* I - Number of rows skipped at start*/
                long    firstrow,      /* I - First row of this iteration    */
                long    nrows,         /* I - Number of rows in this iter    */
                int      nCols,        /* I - Number of columns in use       */
                iteratorCol *colData,  /* IO- Column information/data        */
                void    *userPtr )     /* I - Data handling instructions     */
/*                                                                           */
/* Iterator work function which calls the parser and copies the results      */
/* into either an OutputCol or a data pointer supplied in the userPtr        */
/* structure.                                                                */
/*---------------------------------------------------------------------------*/
{
    int status, constant=0, anyNullThisTime=0;
    long jj, kk, idx, remain, ntodo;
    Node *result;
    iteratorCol * outcol;
    ParseData *lParse = ((parseInfo*)userPtr)->parseData;
    struct ParseStatusVariables *pv = &( ((parseInfo*)userPtr)->parseVariables );
    void *Data0 = 0;

    /* declare variables static to preserve their values between calls */
    long zeros[4] = {0,0,0,0};

    if (DEBUG_PIXFILTER)
       printf("fits_parser_workfn(total=%ld, offset=%ld, first=%ld, rows=%ld, cols=%d)\n",
                totalrows, offset, firstrow, nrows, nCols);
    /*--------------------------------------------------------*/
    /*  Initialization procedures: execute on the first call  */
    /*--------------------------------------------------------*/
    outcol = colData + (nCols - 1);
    if (firstrow == offset+1)
    {
       (pv->userInfo) = (parseInfo*)userPtr;
       (pv->userInfo)->anyNull = 0;

       /* Unfortunately there are two copies of the iterator columns,
	  one inside the parser and one outside maintained by the
	  higher level.  (This could happen if the histogramming
	  routines are binning multiple columns, and so there are
	  multiple parsers being managed at one time.) Upon the first
	  call we make sure they match */
       for (jj = 0; jj<nCols; jj++) {
	 lParse->colData[jj].repeat = colData[jj].repeat;
       }

       if( (pv->userInfo)->maxRows>0 )
          (pv->userInfo)->maxRows = minvalue(totalrows,(pv->userInfo)->maxRows);
       else if( (pv->userInfo)->maxRows<0 )
          (pv->userInfo)->maxRows = totalrows;
       else
          (pv->userInfo)->maxRows = nrows;

       (pv->lastRow) = firstrow + (pv->userInfo)->maxRows - 1;

       /* dataPtr == NULL indicates an iterator-derived column, which
	  means that the first value will be a null value and the remaining
	  values will be the where the outputs are placed */
       if( (pv->userInfo)->dataPtr==NULL ) {

          if( outcol->iotype == InputCol ) {
             ffpmsg("Output column for parser results not found!");
             return( PARSE_NO_OUTPUT );
          }
          /* Data gets set later */
          (pv->Null) = outcol->array;
          (pv->userInfo)->datatype = outcol->datatype;

          /* Check for a TNULL/BLANK keyword for output column/image */

          status = 0;
          (pv->jnull) = 0;
          if (lParse->hdutype == IMAGE_HDU) {
             if (lParse->pixFilter->blank)
                (pv->jnull) = (LONGLONG) lParse->pixFilter->blank;
          }
          else {
	    if (outcol->iotype != TemporaryCol) {
	      ffgknjj( outcol->fptr, "TNULL", outcol->colnum,
		       1, &(pv->jnull), (int*)&jj, &status );
	    }

             if( status==BAD_INTKEY || outcol->iotype == TemporaryCol) {
                /*  Probably ASCII table with text TNULL keyword  */
                switch( (pv->userInfo)->datatype ) {
                   case TSHORT:  (pv->jnull) = (LONGLONG) SHRT_MIN;      break;
                   case TINT:    (pv->jnull) = (LONGLONG) INT_MIN;       break;
                   case TLONG:   (pv->jnull) = (LONGLONG) LONG_MIN;      break;
                }
             }
          }
          (pv->repeat) = outcol->repeat;
/*
          if (DEBUG_PIXFILTER)
            printf("fits_parser_workfn: using null value %ld\n", (pv->jnull));
*/
       } else {

	  /* This clause applies if the user is passing user-allocated 
	     data arrays, which is where the data will be placed.  This 
	     means they should also be passing null values */
          (pv->Data) = (pv->userInfo)->dataPtr;
          (pv->Null) = ((pv->userInfo)->nullPtr ? (pv->userInfo)->nullPtr : zeros);
          (pv->repeat) = lParse->Nodes[lParse->resultNode].value.nelem;

       }

       /* Determine the size of each element of the returned result */

       switch( (pv->userInfo)->datatype ) {
       case TBIT:       /*  Fall through to TBYTE  */
       case TLOGICAL:   /*  Fall through to TBYTE  */
       case TBYTE:     (pv->datasize) = sizeof(char);     break;
       case TSHORT:    (pv->datasize) = sizeof(short);    break;
       case TINT:      (pv->datasize) = sizeof(int);      break;
       case TLONG:     (pv->datasize) = sizeof(long);     break;
       case TLONGLONG: (pv->datasize) = sizeof(LONGLONG); break;
       case TFLOAT:    (pv->datasize) = sizeof(float);    break;
       case TDOUBLE:   (pv->datasize) = sizeof(double);   break;
       case TSTRING:   (pv->datasize) = sizeof(char*);    break;
       }

       /* Determine the size of each element of the calculated result */
       /*   (only matters for numeric/logical data)                   */

       switch( lParse->Nodes[lParse->resultNode].type ) {
       case BOOLEAN:   (pv->resDataSize) = sizeof(char);    break;
       case LONG:      (pv->resDataSize) = sizeof(long);    break;
       case DOUBLE:    (pv->resDataSize) = sizeof(double);  break;
       }
    }

    /*-------------------------------------------*/
    /*  Main loop: process all the rows of data  */
    /*-------------------------------------------*/

    /*  If writing to output column, set first element to appropriate  */
    /*  null value.  If no NULLs encounter, zero out before returning. */
/*
          if (DEBUG_PIXFILTER)
            printf("fits_parser_workfn: using null value %ld\n", (pv->jnull));
*/

    if( (pv->userInfo)->dataPtr == NULL ) {
       /* First, reset Data pointer to start of output array, plus 1
	  because the 0th element is the null value (cute undocumented
	  feature of the iterator!) */
       (pv->Data) = (char*) outcol->array + (pv->datasize);

       /* A TemporaryCol with null value specified explicitly */
       if (outcol->iotype == TemporaryCol && (pv->userInfo)->nullPtr) {

	 pv->Null = (pv->userInfo)->nullPtr;

       } else {

	 /* ... or an OutputCol or TemporaryCol with no explicit null */
	 switch( (pv->userInfo)->datatype ) {
	 case TLOGICAL: *(char  *)(pv->Null) = 'U';             break;
	 case TBYTE:    *(char  *)(pv->Null) = (char )(pv->jnull);    break;
	 case TSHORT:   *(short *)(pv->Null) = (short)(pv->jnull);    break;
	 case TINT:     *(int   *)(pv->Null) = (int  )(pv->jnull);    break;
	 case TLONG:    *(long  *)(pv->Null) = (long )(pv->jnull);    break;
	 case TLONGLONG: *(LONGLONG  *)(pv->Null) = (LONGLONG )(pv->jnull);    break;
	 case TFLOAT:   *(float *)(pv->Null) = FLOATNULLVALUE;  break;
	 case TDOUBLE:  *(double*)(pv->Null) = DOUBLENULLVALUE; break;
	 case TSTRING: (*(char **)(pv->Null))[0] = '\1';
	               (*(char **)(pv->Null))[1] = '\0';        break;
	 }
       }
    }

    /* Alter nrows in case calling routine didn't want to do all rows */

    Data0 = pv->Data; /* Record starting point */
    nrows = minvalue(nrows,(pv->lastRow)-firstrow+1);

    Setup_DataArrays( lParse, nCols, colData, firstrow, nrows );

    /* Parser allocates arrays for each column and calculation it performs. */
    /* Limit number of rows processed during each pass to reduce memory     */
    /* requirements... In most cases, iterator will limit rows to less      */
    /* than 10000 rows per iteration, so this is really only relevant for    */
    /* hk-compressed files which must be decompressed in memory and sent    */
    /* whole to fits_parser_workfn in a single iteration.                           */

    remain = nrows;
    while( remain ) {
       ntodo = minvalue(remain,10000);
       Evaluate_Parser ( lParse, firstrow, ntodo );
       if( lParse->status ) break;

       firstrow += ntodo;
       remain   -= ntodo;

       /*  Copy results into data array  */

       result = lParse->Nodes + lParse->resultNode;
       if( result->operation==CONST_OP ) constant = 1;

       switch( result->type ) {

       case BOOLEAN:
       case LONG:
       case DOUBLE:
          if( constant ) {
             char undef=0;
             for( kk=0; kk<ntodo; kk++ )
                for( jj=0; jj<(pv->repeat); jj++ )
                   ffcvtn( lParse->datatype,
                           &(result->value.data),
                           &undef, result->value.nelem /* 1 */,
                           (pv->userInfo)->datatype, (pv->Null),
                           (char*)(pv->Data) + (kk*(pv->repeat)+jj)*(pv->datasize),
                           &anyNullThisTime, &lParse->status );
          } else {
             if ( (pv->repeat) == result->value.nelem ) {
                ffcvtn( lParse->datatype,
                        result->value.data.ptr,
                        result->value.undef,
                        result->value.nelem*ntodo,
                        (pv->userInfo)->datatype, (pv->Null), (pv->Data),
                        &anyNullThisTime, &lParse->status );
             } else if( result->value.nelem == 1 ) {
                for( kk=0; kk<ntodo; kk++ )
                   for( jj=0; jj<(pv->repeat); jj++ ) {
                      ffcvtn( lParse->datatype,
                              (char*)result->value.data.ptr + kk*(pv->resDataSize),
                              (char*)result->value.undef + kk,
                              1, (pv->userInfo)->datatype, (pv->Null),
                              (char*)(pv->Data) + (kk*(pv->repeat)+jj)*(pv->datasize),
                              &anyNullThisTime, &lParse->status );
                   }
             } else {
                int nCopy;
                nCopy = minvalue( (pv->repeat), result->value.nelem );
                for( kk=0; kk<ntodo; kk++ ) {
                   ffcvtn( lParse->datatype,
                           (char*)result->value.data.ptr
                                  + kk*result->value.nelem*(pv->resDataSize),
                           (char*)result->value.undef
                                  + kk*result->value.nelem,
                           nCopy, (pv->userInfo)->datatype, (pv->Null),
                           (char*)(pv->Data) + (kk*(pv->repeat))*(pv->datasize),
                           &anyNullThisTime, &lParse->status );
                   if( nCopy < (pv->repeat) ) {
                      memset( (char*)(pv->Data) + (kk*(pv->repeat)+nCopy)*(pv->datasize),
                              0, ((pv->repeat)-nCopy)*(pv->datasize));
                   }
                }

             }
             if( result->operation>0 ) {
                FREE( result->value.data.ptr );
             }
          }
          if( lParse->status==OVERFLOW_ERR ) {
             lParse->status = NUM_OVERFLOW;
             ffpmsg("Numerical overflow while converting expression to necessary datatype");
          }
          break;

       case BITSTR:
          switch( (pv->userInfo)->datatype ) {
          case TBYTE:
             idx = -1;
             for( kk=0; kk<ntodo; kk++ ) {
                for( jj=0; jj<result->value.nelem; jj++ ) {
                   if( jj%8 == 0 )
                      ((char*)(pv->Data))[++idx] = 0;
                   if( constant ) {
                      if( result->value.data.str[jj]=='1' )
                         ((char*)(pv->Data))[idx] |= 128>>(jj%8);
                   } else {
                      if( result->value.data.strptr[kk][jj]=='1' )
                         ((char*)(pv->Data))[idx] |= 128>>(jj%8);
                   }
                }
             }
             break;
          case TBIT:
          case TLOGICAL:
             if( constant ) {
                for( kk=0; kk<ntodo; kk++ )
                   for( jj=0; jj<result->value.nelem; jj++ ) {
                      ((char*)(pv->Data))[ jj+kk*result->value.nelem ] =
                         ( result->value.data.str[jj]=='1' );
                   }
             } else {
                for( kk=0; kk<ntodo; kk++ )
                   for( jj=0; jj<result->value.nelem; jj++ ) {
                      ((char*)(pv->Data))[ jj+kk*result->value.nelem ] =
                         ( result->value.data.strptr[kk][jj]=='1' );
                   }
             }
             break; 
          case TSTRING:
             if( constant ) {
                for( jj=0; jj<ntodo; jj++ ) {
                   strcpy( ((char**)(pv->Data))[jj], result->value.data.str );
                }
             } else {
                for( jj=0; jj<ntodo; jj++ ) {
                   strcpy( ((char**)(pv->Data))[jj], result->value.data.strptr[jj] );
                }
             }
             break;
          default:
             ffpmsg("Cannot convert bit expression to desired type.");
             lParse->status = PARSE_BAD_TYPE;
             break;
          }
          if( result->operation>0 ) {
             FREE( result->value.data.strptr[0] );
             FREE( result->value.data.strptr );
          }
          break;

       case STRING:
          if( (pv->userInfo)->datatype==TSTRING ) {
             if( constant ) {
                for( jj=0; jj<ntodo; jj++ )
                   strcpy( ((char**)(pv->Data))[jj], result->value.data.str );
             } else {
                for( jj=0; jj<ntodo; jj++ )
                   if( result->value.undef[jj] ) {
                      anyNullThisTime = 1;
                      strcpy( ((char**)(pv->Data))[jj],
                              *(char **)(pv->Null) );
                   } else {
                      strcpy( ((char**)(pv->Data))[jj],
                              result->value.data.strptr[jj] );
                   }
             }
          } else {
             ffpmsg("Cannot convert string expression to desired type.");
             lParse->status = PARSE_BAD_TYPE;
          }
          if( result->operation>0 ) {
             FREE( result->value.data.strptr[0] );
             FREE( result->value.data.strptr );
          }
          break;
       }

       if( lParse->status ) break;

       /*  Increment Data to point to where the next block should go  */

       if( result->type==BITSTR && (pv->userInfo)->datatype==TBYTE )
          (pv->Data) = (char*)(pv->Data)
                    + (pv->datasize) * ( (result->value.nelem+7)/8 ) * ntodo;
       else if( result->type==STRING )
          (pv->Data) = (char*)(pv->Data) + (pv->datasize) * ntodo;
       else
          (pv->Data) = (char*)(pv->Data) + (pv->datasize) * ntodo * (pv->repeat);
    }

    /* If a TemporaryCol output is used, we want to inform the caller
       what the null value is expected to be */
    if (pv->Null != outcol->array && 
	(Data0) == (char*) outcol->array + (pv->datasize)) {
      if( (pv->userInfo)->datatype == TSTRING )
	memcpy( outcol->array, *(char **)(pv->Null), 2 );
      else 
	memcpy( outcol->array, (pv->Null), (pv->datasize) );
    }

    /* If no NULLs encountered during this pass, set Null value to */
    /* zero to make the writing of the output column data faster   */

    if( anyNullThisTime )
       (pv->userInfo)->anyNull = 1;
    else if( pv->Null == outcol->array ) {
       if( (pv->userInfo)->datatype == TSTRING )
          memcpy( *(char **)(pv->Null), zeros, 2 );
       else 
          memcpy( (pv->Null), zeros, (pv->datasize) );
    }

    /*-------------------------------------------------------*/
    /*  Clean up procedures:  after processing all the rows  */
    /*-------------------------------------------------------*/

    /*  if the calling routine specified that only a limited number    */
    /*  of rows in the table should be processed, return a value of -1 */
    /*  once all the rows have been done, if no other error occurred.  */

    if (lParse->hdutype != IMAGE_HDU && firstrow - 1 == (pv->lastRow)) {
           if (!lParse->status && (pv->userInfo)->maxRows<totalrows) {
                  return (-1);
           }
    }

    return(lParse->status);  /* return successful status */
}